

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O1

void __thiscall amrex::MLABecLaplacian::define_ab_coeffs(MLABecLaplacian *this)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long local_f8;
  undefined1 local_e8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  undefined1 local_98 [104];
  
  iVar2 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  std::
  vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
  ::resize(&(this->m_a_coeffs).
            super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
           ,(long)(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels);
  std::
  vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::resize(&(this->m_b_coeffs).
            super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
           ,(long)(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels);
  if (0 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels) {
    lVar6 = 0;
    do {
      std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::resize
                (&(this->m_a_coeffs).
                  super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar6].
                  super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,
                 (long)(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
                       super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[lVar6]);
      std::
      vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
      resize(&(this->m_b_coeffs).
              super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
              .
              super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar6].
              super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
             ,(long)(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
                    super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[lVar6]);
      lVar5 = lVar6;
      if (0 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
              super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar6]) {
        local_b0 = lVar6 * 3;
        local_f8 = 0;
        lVar4 = 0;
        local_b8 = lVar6;
        do {
          lVar5 = *(long *)&(this->m_a_coeffs).
                            super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar6].
                            super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                            super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
          local_a0 = lVar4 * 0x68;
          local_a8 = lVar4 * 0x10;
          local_98._0_8_ = 1;
          local_98._24_8_ = 0;
          local_98._32_8_ = 0;
          local_98._8_8_ = 0;
          local_98._16_8_ = 0;
          (**(code **)(*(long *)(lVar5 + lVar4 * 0x180) + 0x10))
                    (lVar5 + lVar4 * 0x180,
                     *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids.
                               super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar6].
                               super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                     + local_a0,
                     *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_dmap.
                               super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar6].
                               super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               .
                               super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     + local_a8,1,0,local_98,
                     *(undefined8 *)
                      (*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.
                                 m_factory.
                                 super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                 super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                                 .
                                 super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                      + lVar4 * 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_98 + 0x10));
          lVar7 = 0;
          lVar5 = local_f8;
          do {
            if ((int)lVar7 == 1) {
              uVar3 = 0;
              local_e8._0_4_ = 0;
              local_e8._4_4_ = 1;
            }
            else if ((int)lVar7 == 0) {
              local_e8._0_4_ = 1;
              local_e8._4_4_ = 0;
              uVar3 = 0;
            }
            else {
              uVar3 = 1;
              local_e8._0_4_ = 0;
              local_e8._4_4_ = 0;
            }
            local_e8._8_4_ = uVar3;
            convert((BoxArray *)local_98,
                    (BoxArray *)
                    ((long)&((&(((this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids
                                 .
                                 super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                               ._M_impl.super__Vector_impl_data._M_start)[local_b0]->m_bat).
                            m_bat_type + local_a0),(IntVect *)local_e8);
            lVar1 = *(long *)&(this->m_b_coeffs).
                              super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar6].
                              super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                              .
                              super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
            ;
            local_e8._0_4_ = 1;
            local_e8._4_4_ = 0;
            local_d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_e8._8_8_ = 0;
            local_d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (**(code **)(*(long *)(lVar1 + lVar5) + 0x10))
                      (lVar1 + lVar5,(BoxArray *)local_98,
                       *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_dmap.
                                 super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                 super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                 .
                                 super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                       + local_a8,iVar2,0,(IntVect *)local_e8,
                       *(undefined8 *)
                        (*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.
                                   m_factory.
                                   super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                   .
                                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                   super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                                   .
                                   super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                        + lVar4 * 8));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_d8);
            BoxArray::~BoxArray((BoxArray *)local_98);
            lVar7 = lVar7 + 1;
            lVar5 = lVar5 + 0x180;
          } while (lVar7 != 3);
          lVar4 = lVar4 + 1;
          local_f8 = local_f8 + 0x480;
          lVar5 = local_b8;
        } while (lVar4 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels
                         .super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[local_b8]);
      }
      lVar6 = lVar5 + 1;
    } while (lVar6 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels);
  }
  return;
}

Assistant:

void
MLABecLaplacian::define_ab_coeffs ()
{
    const int ncomp = getNComp();

    m_a_coeffs.resize(m_num_amr_levels);
    m_b_coeffs.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_a_coeffs[amrlev].resize(m_num_mg_levels[amrlev]);
        m_b_coeffs[amrlev].resize(m_num_mg_levels[amrlev]);
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            m_a_coeffs[amrlev][mglev].define(m_grids[amrlev][mglev],
                                             m_dmap[amrlev][mglev],
                                             1, 0, MFInfo(), *m_factory[amrlev][mglev]);
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                const BoxArray& ba = amrex::convert(m_grids[amrlev][mglev],
                                                    IntVect::TheDimensionVector(idim));
                m_b_coeffs[amrlev][mglev][idim].define(ba,
                                                       m_dmap[amrlev][mglev],
                                                       ncomp, 0, MFInfo(), *m_factory[amrlev][mglev]);
            }
        }
    }
}